

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O0

Version * ZXing::QRCode::Version::Model2(int number)

{
  initializer_list<int> alignmentPatternCenters;
  initializer_list<int> alignmentPatternCenters_00;
  initializer_list<int> alignmentPatternCenters_01;
  initializer_list<int> alignmentPatternCenters_02;
  initializer_list<int> alignmentPatternCenters_03;
  initializer_list<int> alignmentPatternCenters_04;
  initializer_list<int> alignmentPatternCenters_05;
  initializer_list<int> alignmentPatternCenters_06;
  initializer_list<int> alignmentPatternCenters_07;
  initializer_list<int> alignmentPatternCenters_08;
  initializer_list<int> alignmentPatternCenters_09;
  initializer_list<int> alignmentPatternCenters_10;
  initializer_list<int> alignmentPatternCenters_11;
  initializer_list<int> alignmentPatternCenters_12;
  initializer_list<int> alignmentPatternCenters_13;
  initializer_list<int> alignmentPatternCenters_14;
  initializer_list<int> alignmentPatternCenters_15;
  initializer_list<int> alignmentPatternCenters_16;
  initializer_list<int> alignmentPatternCenters_17;
  initializer_list<int> alignmentPatternCenters_18;
  initializer_list<int> alignmentPatternCenters_19;
  initializer_list<int> alignmentPatternCenters_20;
  initializer_list<int> alignmentPatternCenters_21;
  initializer_list<int> alignmentPatternCenters_22;
  initializer_list<int> alignmentPatternCenters_23;
  initializer_list<int> alignmentPatternCenters_24;
  initializer_list<int> alignmentPatternCenters_25;
  initializer_list<int> alignmentPatternCenters_26;
  initializer_list<int> alignmentPatternCenters_27;
  initializer_list<int> alignmentPatternCenters_28;
  initializer_list<int> alignmentPatternCenters_29;
  initializer_list<int> alignmentPatternCenters_30;
  initializer_list<int> alignmentPatternCenters_31;
  initializer_list<int> alignmentPatternCenters_32;
  initializer_list<int> alignmentPatternCenters_33;
  initializer_list<int> alignmentPatternCenters_34;
  initializer_list<int> alignmentPatternCenters_35;
  initializer_list<int> alignmentPatternCenters_36;
  initializer_list<int> alignmentPatternCenters_37;
  initializer_list<int> alignmentPatternCenters_38;
  int iVar1;
  int in_EDI;
  array<ZXing::QRCode::ECBlocks,_4UL> *in_stack_ffffffffffffed50;
  undefined8 in_stack_ffffffffffffed58;
  int versionNumber;
  Version *in_stack_ffffffffffffed60;
  iterator in_stack_ffffffffffffed68;
  size_type in_stack_ffffffffffffed70;
  undefined8 local_1288;
  undefined4 uStack_1280;
  undefined4 local_127c;
  undefined4 uStack_1278;
  undefined8 uStack_1274;
  undefined8 *local_1268;
  undefined8 local_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  undefined8 local_1208;
  undefined4 uStack_1200;
  undefined4 local_11fc;
  undefined4 uStack_11f8;
  undefined8 uStack_11f4;
  undefined8 *local_11e8;
  undefined8 local_11e0;
  undefined8 local_11d8;
  undefined8 uStack_11d0;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  undefined8 local_11a8;
  undefined8 uStack_11a0;
  undefined8 local_1198;
  undefined8 uStack_1190;
  undefined8 local_1188;
  undefined4 uStack_1180;
  undefined4 local_117c;
  undefined4 uStack_1178;
  undefined8 uStack_1174;
  undefined8 *local_1168;
  undefined8 local_1160;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined8 uStack_1140;
  undefined8 local_1138;
  undefined8 uStack_1130;
  undefined8 local_1128;
  undefined8 uStack_1120;
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined4 uStack_1100;
  undefined4 local_10fc;
  undefined4 uStack_10f8;
  undefined8 uStack_10f4;
  undefined8 *local_10e8;
  undefined8 local_10e0;
  undefined8 local_10d8;
  undefined8 uStack_10d0;
  undefined8 local_10c8;
  undefined8 uStack_10c0;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined4 uStack_1080;
  undefined4 local_107c;
  undefined4 uStack_1078;
  undefined8 uStack_1074;
  undefined8 *local_1068;
  undefined8 local_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  undefined8 local_1038;
  undefined8 uStack_1030;
  undefined8 local_1028;
  undefined8 uStack_1020;
  undefined8 local_1018;
  undefined8 uStack_1010;
  undefined8 local_1008;
  undefined4 uStack_1000;
  undefined4 local_ffc;
  undefined4 uStack_ff8;
  undefined8 uStack_ff4;
  undefined8 *local_fe8;
  undefined8 local_fe0;
  undefined8 local_fd8;
  undefined8 uStack_fd0;
  undefined8 local_fc8;
  undefined8 uStack_fc0;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  undefined8 uStack_fa0;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 *local_f68;
  undefined8 local_f60;
  undefined8 local_f58;
  undefined8 uStack_f50;
  undefined8 local_f48;
  undefined8 uStack_f40;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined8 uStack_f20;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  undefined8 local_ef8;
  undefined8 *local_ee8;
  undefined8 local_ee0;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined8 local_e78;
  undefined8 *local_e68;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined8 local_e18;
  undefined8 uStack_e10;
  undefined8 local_e08;
  undefined8 uStack_e00;
  undefined8 local_df8;
  undefined8 *local_de8;
  undefined8 local_de0;
  undefined8 local_dd8;
  undefined8 uStack_dd0;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 *local_d68;
  undefined8 local_d60;
  undefined8 local_d58;
  undefined8 uStack_d50;
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined8 local_d38;
  undefined8 uStack_d30;
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined8 local_d18;
  undefined8 uStack_d10;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 *local_ce8;
  undefined8 local_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 *local_c68;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined8 local_c38;
  undefined8 uStack_c30;
  undefined8 local_c28;
  undefined8 uStack_c20;
  undefined8 local_c18;
  undefined8 uStack_c10;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined4 local_bf8;
  undefined8 *local_be8;
  undefined8 local_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined4 local_b78;
  undefined8 *local_b68;
  undefined8 local_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined4 local_af8;
  undefined8 *local_ae8;
  undefined8 local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined4 local_a78;
  undefined8 *local_a68;
  undefined8 local_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined4 local_9f8;
  undefined8 *local_9e8;
  undefined8 local_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  undefined8 local_9a8;
  undefined8 uStack_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined4 local_978;
  undefined8 *local_968;
  undefined8 local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined4 local_8f8;
  undefined8 *local_8e8;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined4 local_888;
  undefined4 local_884;
  undefined4 local_880;
  undefined4 local_87c;
  undefined4 *local_878;
  undefined8 local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined4 local_818;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 *local_808;
  undefined8 local_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined4 local_7a8;
  undefined4 local_7a4;
  undefined4 local_7a0;
  undefined4 local_79c;
  undefined4 *local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined4 local_72c;
  undefined4 *local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined4 local_6bc;
  undefined4 *local_6b8;
  undefined8 local_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_658;
  undefined4 local_654;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 *local_648;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 *local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined4 local_574;
  undefined4 local_570;
  undefined4 local_56c;
  undefined4 *local_568;
  undefined8 local_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined4 local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 *local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 *local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined4 local_424;
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 *local_418;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 *local_3a8;
  undefined8 local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_344;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 *local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 *local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 *local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined4 local_1f0;
  undefined4 local_1ec;
  undefined4 *local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined4 local_180;
  undefined4 local_17c;
  undefined4 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 *local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 *local_98;
  undefined8 local_90;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  initializer_list<int> local_28;
  Version *local_18;
  int local_c;
  Version *local_8;
  
  versionNumber = (int)((ulong)in_stack_ffffffffffffed58 >> 0x20);
  local_c = in_EDI;
  if (Model2(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Model2(int)::allVersions);
    if (iVar1 != 0) {
      local_18 = Model2::allVersions;
      std::initializer_list<int>::initializer_list(&local_28);
      local_38 = 0x900000001;
      uStack_30 = 0;
      local_48 = 0xd;
      uStack_40 = 0x1100000000;
      local_58 = 0;
      uStack_50 = 0x10000000d;
      local_68 = 0xa00000000;
      uStack_60 = 0x1000000001;
      local_78 = 0x100000007;
      uStack_70 = 0x13;
      alignmentPatternCenters._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b1e48;
      local_a0 = 6;
      local_9c = 0x12;
      local_98 = &local_a0;
      local_90 = 2;
      local_b8 = 0x1000000001;
      uStack_b0 = 0;
      local_c8 = 0x16;
      uStack_c0 = 0x1c00000000;
      local_d8 = 0;
      uStack_d0 = 0x100000016;
      local_e8 = 0x1000000000;
      uStack_e0 = 0x1c00000001;
      local_f8 = 0x10000000a;
      uStack_f0 = 0x22;
      alignmentPatternCenters_00._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_00._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_00,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b1ec0;
      local_110 = 6;
      local_10c = 0x16;
      local_108 = &local_110;
      local_100 = 2;
      local_128 = 0xd00000002;
      uStack_120 = 0;
      local_138 = 0x11;
      uStack_130 = 0x1600000000;
      local_148 = 0;
      uStack_140 = 0x200000012;
      local_158 = 0x1a00000000;
      uStack_150 = 0x2c00000001;
      local_168 = 0x10000000f;
      uStack_160 = 0x37;
      alignmentPatternCenters_01._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_01._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_01,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b1f38;
      local_180 = 6;
      local_17c = 0x1a;
      local_178 = &local_180;
      local_170 = 2;
      local_198 = 0x900000004;
      uStack_190 = 0;
      local_1a8 = 0x18;
      uStack_1a0 = 0x1000000000;
      local_1b8 = 0;
      uStack_1b0 = 0x20000001a;
      local_1c8 = 0x1200000000;
      uStack_1c0 = 0x2000000002;
      local_1d8 = 0x100000014;
      uStack_1d0 = 0x50;
      alignmentPatternCenters_02._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_02._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_02,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b1fb0;
      local_1f0 = 6;
      local_1ec = 0x1e;
      local_1e8 = &local_1f0;
      local_1e0 = 2;
      local_208 = 0xb00000002;
      uStack_200 = 0xc00000002;
      local_218 = 0x20000000f;
      uStack_210 = 0x1600000010;
      local_228 = 0;
      uStack_220 = 0x200000012;
      local_238 = 0x1800000000;
      uStack_230 = 0x2b00000002;
      local_248 = 0x10000001a;
      uStack_240 = 0x6c;
      alignmentPatternCenters_03._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_03._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_03,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2028;
      local_260 = 6;
      local_25c = 0x22;
      local_258 = &local_260;
      local_250 = 2;
      local_278 = 0xf00000004;
      uStack_270 = 0;
      local_288 = 0x13;
      uStack_280 = 0x1c00000000;
      local_298 = 0;
      uStack_290 = 0x400000018;
      local_2a8 = 0x1000000000;
      uStack_2a0 = 0x1b00000004;
      local_2b8 = 0x200000012;
      uStack_2b0 = 0x44;
      alignmentPatternCenters_04._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_04._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_04,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b20a0;
      local_2d4 = 6;
      local_2d0 = 0x16;
      local_2cc = 0x26;
      local_2c8 = &local_2d4;
      local_2c0 = 3;
      local_2e8 = 0xd00000004;
      uStack_2e0 = 0xe00000001;
      local_2f8 = 0x40000000e;
      uStack_2f0 = 0x1a0000000f;
      local_308 = 0;
      uStack_300 = 0x200000012;
      local_318 = 0x1200000000;
      uStack_310 = 0x1f00000004;
      local_328 = 0x200000014;
      uStack_320 = 0x4e;
      alignmentPatternCenters_05._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_05._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_05,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2118;
      local_344 = 6;
      local_340 = 0x18;
      local_33c = 0x2a;
      local_338 = &local_344;
      local_330 = 3;
      local_358 = 0xe00000004;
      uStack_350 = 0xf00000002;
      local_368 = 0x200000012;
      uStack_360 = 0x1a00000013;
      local_378 = 0x2700000002;
      uStack_370 = 0x400000016;
      local_388 = 0x1600000000;
      uStack_380 = 0x2600000002;
      local_398 = 0x200000018;
      uStack_390 = 0x61;
      alignmentPatternCenters_06._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_06._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_06,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2190;
      local_3b4 = 6;
      local_3b0 = 0x1a;
      local_3ac = 0x2e;
      local_3a8 = &local_3b4;
      local_3a0 = 3;
      local_3c8 = 0xc00000004;
      uStack_3c0 = 0xd00000004;
      local_3d8 = 0x400000010;
      uStack_3d0 = 0x1800000011;
      local_3e8 = 0x2500000002;
      uStack_3e0 = 0x400000014;
      local_3f8 = 0x1600000000;
      uStack_3f0 = 0x2400000003;
      local_408 = 0x20000001e;
      uStack_400 = 0x74;
      alignmentPatternCenters_07._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_07._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_07,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2208;
      local_424 = 6;
      local_420 = 0x1c;
      local_41c = 0x32;
      local_418 = &local_424;
      local_410 = 3;
      local_438 = 0xf00000006;
      uStack_430 = 0x1000000002;
      local_448 = 0x200000013;
      uStack_440 = 0x1c00000014;
      local_458 = 0x2c00000001;
      uStack_450 = 0x600000018;
      local_468 = 0x1a00000045;
      uStack_460 = 0x2b00000004;
      local_478 = 0x200000012;
      uStack_470 = 0x200000044;
      alignmentPatternCenters_08._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_08._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_08,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2280;
      local_494 = 6;
      local_490 = 0x1e;
      local_48c = 0x36;
      local_488 = &local_494;
      local_480 = 3;
      local_4a8 = 0xc00000003;
      uStack_4a0 = 0xd00000008;
      local_4b8 = 0x400000016;
      uStack_4b0 = 0x1800000017;
      local_4c8 = 0x3300000004;
      uStack_4c0 = 0x40000001c;
      local_4d8 = 0x1e00000000;
      uStack_4d0 = 0x3200000001;
      local_4e8 = 0x400000014;
      uStack_4e0 = 0x51;
      alignmentPatternCenters_09._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_09._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_09,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b22f8;
      local_504 = 6;
      local_500 = 0x20;
      local_4fc = 0x3a;
      local_4f8 = &local_504;
      local_4f0 = 3;
      local_518 = 0xe00000007;
      uStack_510 = 0xf00000004;
      local_528 = 0x600000014;
      uStack_520 = 0x1c00000015;
      local_538 = 0x2500000002;
      uStack_530 = 0x40000001a;
      local_548 = 0x160000005d;
      uStack_540 = 0x2400000006;
      local_558 = 0x200000018;
      uStack_550 = 0x20000005c;
      alignmentPatternCenters_10._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_10._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_10,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2370;
      local_574 = 6;
      local_570 = 0x22;
      local_56c = 0x3e;
      local_568 = &local_574;
      local_560 = 3;
      local_588 = 0xb0000000c;
      uStack_580 = 0xc00000004;
      local_598 = 0x400000014;
      uStack_590 = 0x1600000015;
      local_5a8 = 0x2600000001;
      uStack_5a0 = 0x800000018;
      local_5b8 = 0x1600000000;
      uStack_5b0 = 0x2500000008;
      local_5c8 = 0x40000001a;
      uStack_5c0 = 0x6b;
      alignmentPatternCenters_11._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_11._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_11,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b23e8;
      local_5e8 = 6;
      local_5e4 = 0x1a;
      local_5e0 = 0x2e;
      local_5dc = 0x42;
      local_5d8 = &local_5e8;
      local_5d0 = 4;
      local_5f8 = 0xc0000000b;
      uStack_5f0 = 0xd00000005;
      local_608 = 0x500000010;
      uStack_600 = 0x1800000011;
      local_618 = 0x2900000005;
      uStack_610 = 0xb00000014;
      local_628 = 0x1800000074;
      uStack_620 = 0x2800000004;
      local_638 = 0x30000001e;
      uStack_630 = 0x100000073;
      alignmentPatternCenters_12._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_12._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_12,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2460;
      local_658 = 6;
      local_654 = 0x1a;
      local_650 = 0x30;
      local_64c = 0x46;
      local_648 = &local_658;
      local_640 = 4;
      local_668 = 0xc0000000b;
      uStack_660 = 0xd00000007;
      local_678 = 0x700000018;
      uStack_670 = 0x1800000019;
      local_688 = 0x2a00000005;
      uStack_680 = 0x50000001e;
      local_698 = 0x1800000058;
      uStack_690 = 0x2900000005;
      local_6a8 = 0x500000016;
      uStack_6a0 = 0x100000057;
      alignmentPatternCenters_13._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_13._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_13,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b24d8;
      local_6c8 = 6;
      local_6c4 = 0x1a;
      local_6c0 = 0x32;
      local_6bc = 0x4a;
      local_6b8 = &local_6c8;
      local_6b0 = 4;
      local_6d8 = 0xf00000003;
      uStack_6d0 = 0x100000000d;
      local_6e8 = 0x200000013;
      uStack_6e0 = 0x1e00000014;
      local_6f8 = 0x2e00000003;
      uStack_6f0 = 0xf00000018;
      local_708 = 0x1c00000063;
      uStack_700 = 0x2d00000007;
      local_718 = 0x500000018;
      uStack_710 = 0x100000062;
      alignmentPatternCenters_14._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_14._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_14,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2550;
      local_738 = 6;
      local_734 = 0x1e;
      local_730 = 0x36;
      local_72c = 0x4e;
      local_728 = &local_738;
      local_720 = 4;
      local_748 = 0xe00000002;
      uStack_740 = 0xf00000011;
      local_758 = 0xf00000016;
      uStack_750 = 0x1c00000017;
      local_768 = 0x2f00000001;
      uStack_760 = 0x10000001c;
      local_778 = 0x1c0000006c;
      uStack_770 = 0x2e0000000a;
      local_788 = 0x10000001c;
      uStack_780 = 0x50000006b;
      alignmentPatternCenters_15._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_15._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_15,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b25c8;
      local_7a8 = 6;
      local_7a4 = 0x1e;
      local_7a0 = 0x38;
      local_79c = 0x52;
      local_798 = &local_7a8;
      local_790 = 4;
      local_7b8 = 0xe00000002;
      uStack_7b0 = 0xf00000013;
      local_7c8 = 0x100000016;
      uStack_7c0 = 0x1c00000017;
      local_7d8 = 0x2c00000004;
      uStack_7d0 = 0x110000001c;
      local_7e8 = 0x1a00000079;
      uStack_7e0 = 0x2b00000009;
      local_7f8 = 0x50000001e;
      uStack_7f0 = 0x100000078;
      alignmentPatternCenters_16._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_16._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_16,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2640;
      local_818 = 6;
      local_814 = 0x1e;
      local_810 = 0x3a;
      local_80c = 0x56;
      local_808 = &local_818;
      local_800 = 4;
      local_828 = 0xd00000009;
      uStack_820 = 0xe00000010;
      local_838 = 0x400000015;
      uStack_830 = 0x1a00000016;
      local_848 = 0x2d0000000b;
      uStack_840 = 0x110000001a;
      local_858 = 0x1a00000072;
      uStack_850 = 0x2c00000003;
      local_868 = 0x30000001c;
      uStack_860 = 0x400000071;
      alignmentPatternCenters_17._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_17._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_17,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b26b8;
      local_888 = 6;
      local_884 = 0x22;
      local_880 = 0x3e;
      local_87c = 0x5a;
      local_878 = &local_888;
      local_870 = 4;
      local_898 = 0xf0000000f;
      uStack_890 = 0x100000000a;
      local_8a8 = 0x500000018;
      uStack_8a0 = 0x1c00000019;
      local_8b8 = 0x2a0000000d;
      uStack_8b0 = 0xf0000001e;
      local_8c8 = 0x1a0000006c;
      uStack_8c0 = 0x2900000003;
      local_8d8 = 0x30000001c;
      uStack_8d0 = 0x50000006b;
      alignmentPatternCenters_18._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_18._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_18,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2730;
      local_908 = 0x1c00000006;
      uStack_900 = 0x4800000032;
      local_8f8 = 0x5e;
      local_8e8 = &local_908;
      local_8e0 = 5;
      local_918 = 0x1000000013;
      uStack_910 = 0x1100000006;
      local_928 = 0x600000016;
      uStack_920 = 0x1e00000017;
      local_938 = 0;
      uStack_930 = 0x110000001c;
      local_948 = 0x1a00000075;
      uStack_940 = 0x2a00000011;
      local_958 = 0x40000001c;
      uStack_950 = 0x400000074;
      alignmentPatternCenters_19._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_19._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_19,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b27a8;
      local_988 = 0x1a00000006;
      uStack_980 = 0x4a00000032;
      local_978 = 0x62;
      local_968 = &local_988;
      local_960 = 5;
      local_998 = 0xd00000022;
      uStack_990 = 0;
      local_9a8 = 0x1000000018;
      uStack_9a0 = 0x1800000019;
      local_9b8 = 0;
      uStack_9b0 = 0x70000001e;
      local_9c8 = 0x1c00000070;
      uStack_9c0 = 0x2e00000011;
      local_9d8 = 0x20000001c;
      uStack_9d0 = 0x70000006f;
      alignmentPatternCenters_20._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_20._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_20,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2820;
      local_a08 = 0x1e00000006;
      uStack_a00 = 0x4e00000036;
      local_9f8 = 0x66;
      local_9e8 = &local_a08;
      local_9e0 = 5;
      local_a18 = 0xf00000010;
      uStack_a10 = 0x100000000e;
      local_a28 = 0xe00000018;
      uStack_a20 = 0x1e00000019;
      local_a38 = 0x300000000e;
      uStack_a30 = 0xb0000001e;
      local_a48 = 0x1c0000007a;
      uStack_a40 = 0x2f00000004;
      local_a58 = 0x40000001e;
      uStack_a50 = 0x500000079;
      alignmentPatternCenters_21._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_21._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_21,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2898;
      local_a88 = 0x1c00000006;
      uStack_a80 = 0x5000000036;
      local_a78 = 0x6a;
      local_a68 = &local_a88;
      local_a60 = 5;
      local_a98 = 0x100000001e;
      uStack_a90 = 0x1100000002;
      local_aa8 = 0x1000000018;
      uStack_aa0 = 0x1e00000019;
      local_ab8 = 0x2e0000000e;
      uStack_ab0 = 0xb0000001e;
      local_ac8 = 0x1c00000076;
      uStack_ac0 = 0x2d00000006;
      local_ad8 = 0x60000001e;
      uStack_ad0 = 0x400000075;
      alignmentPatternCenters_22._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_22._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_22,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2910;
      local_b08 = 0x2000000006;
      uStack_b00 = 0x540000003a;
      local_af8 = 0x6e;
      local_ae8 = &local_b08;
      local_ae0 = 5;
      local_b18 = 0xf00000016;
      uStack_b10 = 0x100000000d;
      local_b28 = 0x1600000018;
      uStack_b20 = 0x1e00000019;
      local_b38 = 0x300000000d;
      uStack_b30 = 0x70000001e;
      local_b48 = 0x1c0000006b;
      uStack_b40 = 0x2f00000008;
      local_b58 = 0x80000001a;
      uStack_b50 = 0x40000006a;
      alignmentPatternCenters_23._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_23._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_23,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2988;
      local_b88 = 0x1e00000006;
      uStack_b80 = 0x560000003a;
      local_b78 = 0x72;
      local_b68 = &local_b88;
      local_b60 = 5;
      local_b98 = 0x1000000021;
      uStack_b90 = 0x1100000004;
      local_ba8 = 0x600000016;
      uStack_ba0 = 0x1e00000017;
      local_bb8 = 0x2f00000004;
      uStack_bb0 = 0x1c0000001c;
      local_bc8 = 0x1c00000073;
      uStack_bc0 = 0x2e00000013;
      local_bd8 = 0xa0000001c;
      uStack_bd0 = 0x200000072;
      alignmentPatternCenters_24._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_24._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_24,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2a00;
      local_c08 = 0x2200000006;
      uStack_c00 = 0x5a0000003e;
      local_bf8 = 0x76;
      local_be8 = &local_c08;
      local_be0 = 5;
      local_c18 = 0xf0000000c;
      uStack_c10 = 0x100000001c;
      local_c28 = 0x1a00000017;
      uStack_c20 = 0x1e00000018;
      local_c38 = 0x2e00000003;
      uStack_c30 = 0x80000001e;
      local_c48 = 0x1c0000007b;
      uStack_c40 = 0x2d00000016;
      local_c58 = 0x80000001e;
      uStack_c50 = 0x40000007a;
      alignmentPatternCenters_25._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_25._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_25,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2a78;
      local_c78 = 0x7a00000062;
      local_c88 = 0x1a00000006;
      uStack_c80 = 0x4a00000032;
      local_c68 = &local_c88;
      local_c60 = 6;
      local_c98 = 0xf0000000b;
      uStack_c90 = 0x100000001f;
      local_ca8 = 0x1f00000018;
      uStack_ca0 = 0x1e00000019;
      local_cb8 = 0x2e00000017;
      uStack_cb0 = 0x40000001e;
      local_cc8 = 0x1c00000076;
      uStack_cc0 = 0x2d00000003;
      local_cd8 = 0x30000001e;
      uStack_cd0 = 0xa00000075;
      alignmentPatternCenters_26._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_26._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_26,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2af0;
      local_cf8 = 0x7e00000066;
      local_d08 = 0x1e00000006;
      uStack_d00 = 0x4e00000036;
      local_ce8 = &local_d08;
      local_ce0 = 6;
      local_d18 = 0xf00000013;
      uStack_d10 = 0x100000001a;
      local_d28 = 0x2500000017;
      uStack_d20 = 0x1e00000018;
      local_d38 = 0x2e00000007;
      uStack_d30 = 0x10000001e;
      local_d48 = 0x1c00000075;
      uStack_d40 = 0x2d00000015;
      local_d58 = 0x70000001e;
      uStack_d50 = 0x700000074;
      alignmentPatternCenters_27._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_27._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_27,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2b68;
      local_d78 = 0x8200000068;
      local_d88 = 0x1a00000006;
      uStack_d80 = 0x4e00000034;
      local_d68 = &local_d88;
      local_d60 = 6;
      local_d98 = 0xf00000017;
      uStack_d90 = 0x1000000019;
      local_da8 = 0x1900000018;
      uStack_da0 = 0x1e00000019;
      local_db8 = 0x300000000a;
      uStack_db0 = 0xf0000001e;
      local_dc8 = 0x1c00000074;
      uStack_dc0 = 0x2f00000013;
      local_dd8 = 0x50000001e;
      uStack_dd0 = 0xa00000073;
      alignmentPatternCenters_28._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_28._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_28,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2be0;
      local_df8 = 0x860000006c;
      local_e08 = 0x1e00000006;
      uStack_e00 = 0x5200000038;
      local_de8 = &local_e08;
      local_de0 = 6;
      local_e18 = 0xf00000017;
      uStack_e10 = 0x100000001c;
      local_e28 = 0x100000018;
      uStack_e20 = 0x1e00000019;
      local_e38 = 0x2f0000001d;
      uStack_e30 = 0x2a0000001e;
      local_e48 = 0x1c00000074;
      uStack_e40 = 0x2e00000002;
      local_e58 = 0xd0000001e;
      uStack_e50 = 0x300000073;
      alignmentPatternCenters_29._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_29._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_29,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2c58;
      local_e78 = 0x8a00000070;
      local_e88 = 0x2200000006;
      uStack_e80 = 0x560000003c;
      local_e68 = &local_e88;
      local_e60 = 6;
      local_e98 = 0xf00000013;
      uStack_e90 = 0x1000000023;
      local_ea8 = 0x2300000018;
      uStack_ea0 = 0x1e00000019;
      local_eb8 = 0x2f00000017;
      uStack_eb0 = 0xa0000001e;
      local_ec8 = 0x1c00000000;
      uStack_ec0 = 0x2e0000000a;
      local_ed8 = 0x110000001e;
      uStack_ed0 = 0x73;
      alignmentPatternCenters_30._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_30._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_30,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2cd0;
      local_ef8 = 0x8e00000072;
      local_f08 = 0x1e00000006;
      uStack_f00 = 0x560000003a;
      local_ee8 = &local_f08;
      local_ee0 = 6;
      local_f18 = 0xf0000000b;
      uStack_f10 = 0x100000002e;
      local_f28 = 0x1300000018;
      uStack_f20 = 0x1e00000019;
      local_f38 = 0x2f00000015;
      uStack_f30 = 0x1d0000001e;
      local_f48 = 0x1c00000074;
      uStack_f40 = 0x2e0000000e;
      local_f58 = 0x110000001e;
      uStack_f50 = 0x100000073;
      alignmentPatternCenters_31._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_31._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_31,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2d48;
      local_f78 = 0x9200000076;
      local_f88 = 0x2200000006;
      uStack_f80 = 0x5a0000003e;
      local_f68 = &local_f88;
      local_f60 = 6;
      local_f98 = 0x100000003b;
      uStack_f90 = 0x1100000001;
      local_fa8 = 0x700000018;
      uStack_fa0 = 0x1e00000019;
      local_fb8 = 0x2f00000017;
      uStack_fb0 = 0x2c0000001e;
      local_fc8 = 0x1c00000074;
      uStack_fc0 = 0x2e0000000e;
      local_fd8 = 0xd0000001e;
      uStack_fd0 = 0x600000073;
      alignmentPatternCenters_32._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_32._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_32,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2dc0;
      uStack_ff8 = 0x66;
      uStack_ff4 = 0x960000007e;
      local_1008 = 0x1e00000006;
      uStack_1000 = 0x36;
      local_ffc = 0x4e;
      local_fe8 = &local_1008;
      local_fe0 = 7;
      local_1018 = 0xf00000016;
      uStack_1010 = 0x1000000029;
      local_1028 = 0xe00000018;
      uStack_1020 = 0x1e00000019;
      local_1038 = 0x300000001a;
      uStack_1030 = 0x270000001e;
      local_1048 = 0x1c0000007a;
      uStack_1040 = 0x2f0000000c;
      local_1058 = 0xc0000001e;
      uStack_1050 = 0x700000079;
      alignmentPatternCenters_33._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_33._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_33,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2e38;
      uStack_1078 = 0x66;
      uStack_1074 = 0x9a00000080;
      local_1088 = 0x1800000006;
      uStack_1080 = 0x32;
      local_107c = 0x4c;
      local_1068 = &local_1088;
      local_1060 = 7;
      local_1098 = 0xf00000002;
      uStack_1090 = 0x1000000040;
      local_10a8 = 0xa00000018;
      uStack_10a0 = 0x1e00000019;
      local_10b8 = 0x3000000022;
      uStack_10b0 = 0x2e0000001e;
      local_10c8 = 0x1c0000007a;
      uStack_10c0 = 0x2f00000006;
      local_10d8 = 0x60000001e;
      uStack_10d0 = 0xe00000079;
      alignmentPatternCenters_34._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_34._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_34,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2eb0;
      uStack_10f8 = 0x6a;
      uStack_10f4 = 0x9e00000084;
      local_1108 = 0x1c00000006;
      uStack_1100 = 0x36;
      local_10fc = 0x50;
      local_10e8 = &local_1108;
      local_10e0 = 7;
      local_1118 = 0xf00000018;
      uStack_1110 = 0x100000002e;
      local_1128 = 0xa00000018;
      uStack_1120 = 0x1e00000019;
      local_1138 = 0x2f0000000e;
      uStack_1130 = 0x310000001e;
      local_1148 = 0x1c0000007b;
      uStack_1140 = 0x2e0000001d;
      local_1158 = 0x110000001e;
      uStack_1150 = 0x40000007a;
      alignmentPatternCenters_35._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_35._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_35,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2f28;
      uStack_1178 = 0x6e;
      uStack_1174 = 0xa200000088;
      local_1188 = 0x2000000006;
      uStack_1180 = 0x3a;
      local_117c = 0x54;
      local_1168 = &local_1188;
      local_1160 = 7;
      local_1198 = 0xf0000002a;
      uStack_1190 = 0x1000000020;
      local_11a8 = 0xe00000018;
      uStack_11a0 = 0x1e00000019;
      local_11b8 = 0x2f00000020;
      uStack_11b0 = 0x300000001e;
      local_11c8 = 0x1c0000007b;
      uStack_11c0 = 0x2e0000000d;
      local_11d8 = 0x40000001e;
      uStack_11d0 = 0x120000007a;
      alignmentPatternCenters_36._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_36._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_36,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b2fa0;
      uStack_11f8 = 0x6e;
      uStack_11f4 = 0xa60000008a;
      local_1208 = 0x1a00000006;
      uStack_1200 = 0x36;
      local_11fc = 0x52;
      local_11e8 = &local_1208;
      local_11e0 = 7;
      local_1218 = 0xf0000000a;
      uStack_1210 = 0x1000000043;
      local_1228 = 0x1600000018;
      uStack_1220 = 0x1e00000019;
      local_1238 = 0x3000000007;
      uStack_1230 = 0x2b0000001e;
      local_1248 = 0x1c00000076;
      uStack_1240 = 0x2f00000028;
      local_1258 = 0x140000001e;
      uStack_1250 = 0x400000075;
      alignmentPatternCenters_37._M_len = in_stack_ffffffffffffed70;
      alignmentPatternCenters_37._M_array = in_stack_ffffffffffffed68;
      Version(in_stack_ffffffffffffed60,versionNumber,alignmentPatternCenters_37,
              in_stack_ffffffffffffed50);
      local_18 = (Version *)0x3b3018;
      uStack_1278 = 0x72;
      uStack_1274 = 0xaa0000008e;
      local_1288 = 0x1e00000006;
      uStack_1280 = 0x3a;
      local_127c = 0x56;
      local_1268 = &local_1288;
      local_1260 = 7;
      alignmentPatternCenters_38._M_len = 0x100000003d;
      alignmentPatternCenters_38._M_array = (iterator)0xf00000014;
      Version((Version *)0x1e00000019,0x22,alignmentPatternCenters_38,
              (array<ZXing::QRCode::ECBlocks,_4UL> *)0x220000001e);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&Model2(int)::allVersions);
    }
  }
  if ((local_c < 1) || (0x28 < local_c)) {
    local_8 = (Version *)0x0;
  }
  else {
    local_8 = (Version *)
              &(&Pdf417::GetModulusGF::field)[local_c]._expTable.
               super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
               _M_finish;
  }
  return local_8;
}

Assistant:

const Version* Version::Model2(int number)
{
	/**
	* See ISO 18004:2006 6.5.1 Table 9
	*/
	static const Version allVersions[] = {
		{1, {}, {
			7,  1, 19, 0, 0,
			10, 1, 16, 0, 0,
			13, 1, 13, 0, 0,
			17, 1, 9 , 0, 0
			}},
		{2, {6, 18}, {
			10, 1, 34, 0, 0,
			16, 1, 28, 0, 0,
			22, 1, 22, 0, 0,
			28, 1, 16, 0, 0,
			}},
		{3, {6, 22}, {
			15, 1, 55, 0, 0,
			26, 1, 44, 0, 0,
			18, 2, 17, 0, 0,
			22, 2, 13, 0, 0,
			}},
		{4, {6, 26}, {
			20, 1, 80, 0, 0,
			18, 2, 32, 0, 0,
			26, 2, 24, 0, 0,
			16, 4, 9 , 0, 0,
			}},
		{5, {6, 30}, {
			26, 1, 108, 0, 0,
			24, 2, 43 , 0, 0,
			18, 2, 15 , 2, 16,
			22, 2, 11 , 2, 12,
			}},
		{6, {6, 34}, {
			18, 2, 68, 0, 0,
			16, 4, 27, 0, 0,
			24, 4, 19, 0, 0,
			28, 4, 15, 0, 0,
			}},
		{7, {6, 22, 38}, {
			20, 2, 78, 0, 0,
			18, 4, 31, 0, 0,
			18, 2, 14, 4, 15,
			26, 4, 13, 1, 14,
			}},
		{8, {6, 24, 42}, {
			24, 2, 97, 0, 0,
			22, 2, 38, 2, 39,
			22, 4, 18, 2, 19,
			26, 4, 14, 2, 15,
			}},
		{9, {6, 26, 46}, {
			30, 2, 116, 0, 0,
			22, 3, 36, 2, 37,
			20, 4, 16, 4, 17,
			24, 4, 12, 4, 13,
			}},
		{10, {6, 28, 50}, {
			18, 2, 68, 2, 69,
			26, 4, 43, 1, 44,
			24, 6, 19, 2, 20,
			28, 6, 15, 2, 16,
			}},
		{11, {6, 30, 54}, {
			20, 4, 81, 0, 0,
			30, 1, 50, 4, 51,
			28, 4, 22, 4, 23,
			24, 3, 12, 8, 13,
			}},
		{12, {6, 32, 58}, {
			24, 2, 92, 2, 93,
			22, 6, 36, 2, 37,
			26, 4, 20, 6, 21,
			28, 7, 14, 4, 15,
			}},
		{13, {6, 34, 62}, {
			26, 4, 107, 0, 0,
			22, 8, 37, 1, 38,
			24, 8, 20, 4, 21,
			22, 12, 11, 4, 12,
			}},
		{14, {6, 26, 46, 66}, {
			30, 3, 115, 1, 116,
			24, 4, 40, 5, 41,
			20, 11, 16, 5, 17,
			24, 11, 12, 5, 13,
			}},
		{15, {6, 26, 48, 70}, {
			22, 5, 87, 1, 88,
			24, 5, 41, 5, 42,
			30, 5, 24, 7, 25,
			24, 11, 12, 7, 13,
			}},
		{16, {6, 26, 50, 74}, {
			24, 5, 98, 1, 99,
			28, 7, 45, 3, 46,
			24, 15, 19, 2, 20,
			30, 3, 15, 13, 16,
			}},
		{17, {6, 30, 54, 78}, {
			28, 1, 107, 5, 108,
			28, 10, 46, 1, 47,
			28, 1, 22, 15, 23,
			28, 2, 14, 17, 15,
			}},
		{18, {6, 30, 56, 82}, {
			30, 5, 120, 1, 121,
			26, 9, 43, 4, 44,
			28, 17, 22, 1, 23,
			28, 2, 14, 19, 15,
			}},
		{19, {6, 30, 58, 86}, {
			28, 3, 113, 4, 114,
			26, 3, 44, 11, 45,
			26, 17, 21, 4, 22,
			26, 9, 13, 16, 14,
			}},
		{20, {6, 34, 62, 90}, {
			28, 3, 107, 5, 108,
			26, 3, 41, 13, 42,
			30, 15, 24, 5, 25,
			28, 15, 15, 10, 16,
			}},
		{21, {6, 28, 50, 72, 94}, {
			28, 4, 116, 4, 117,
			26, 17, 42, 0, 0,
			28, 17, 22, 6, 23,
			30, 19, 16, 6, 17,
			}},
		{22, {6, 26, 50, 74, 98}, {
			28, 2, 111, 7, 112,
			28, 17, 46, 0, 0,
			30, 7, 24, 16, 25,
			24, 34, 13, 0, 0,
			}},
		{23, {6, 30, 54, 78, 102}, {
			30, 4, 121, 5, 122,
			28, 4, 47, 14, 48,
			30, 11, 24, 14, 25,
			30, 16, 15, 14, 16,
			}},
		{24, {6, 28, 54, 80, 106}, {
			30, 6, 117, 4, 118,
			28, 6, 45, 14, 46,
			30, 11, 24, 16, 25,
			30, 30, 16, 2, 17,
			}},
		{25, {6, 32, 58, 84, 110}, {
			26, 8, 106, 4, 107,
			28, 8, 47, 13, 48,
			30, 7, 24, 22, 25,
			30, 22, 15, 13, 16,
			}},
		{26, {6, 30, 58, 86, 114}, {
			28, 10, 114, 2, 115,
			28, 19, 46, 4, 47,
			28, 28, 22, 6, 23,
			30, 33, 16, 4, 17,
			}},
		{27, {6, 34, 62, 90, 118}, {
			30, 8, 122, 4, 123,
			28, 22, 45, 3, 46,
			30, 8, 23, 26, 24,
			30, 12, 15, 28, 16,
			}},
		{28, {6, 26, 50, 74, 98, 122}, {
			30, 3, 117, 10, 118,
			28, 3, 45, 23, 46,
			30, 4, 24, 31, 25,
			30, 11, 15, 31, 16,
			}},
		{29, {6, 30, 54, 78, 102, 126}, {
			30, 7, 116, 7, 117,
			28, 21, 45, 7, 46,
			30, 1, 23, 37, 24,
			30, 19, 15, 26, 16,
			}},
		{30, {6, 26, 52, 78, 104, 130}, {
			30, 5, 115, 10, 116,
			28, 19, 47, 10, 48,
			30, 15, 24, 25, 25,
			30, 23, 15, 25, 16,
			}},
		{31, {6, 30, 56, 82, 108, 134}, {
			30, 13, 115, 3, 116,
			28, 2, 46, 29, 47,
			30, 42, 24, 1, 25,
			30, 23, 15, 28, 16,
			}},
		{32, {6, 34, 60, 86, 112, 138}, {
			30, 17, 115, 0, 0,
			28, 10, 46, 23, 47,
			30, 10, 24, 35, 25,
			30, 19, 15, 35, 16,
			}},
		{33, {6, 30, 58, 86, 114, 142}, {
			30, 17, 115, 1, 116,
			28, 14, 46, 21, 47,
			30, 29, 24, 19, 25,
			30, 11, 15, 46, 16,
			}},
		{34, {6, 34, 62, 90, 118, 146}, {
			30, 13, 115, 6, 116,
			28, 14, 46, 23, 47,
			30, 44, 24, 7, 25,
			30, 59, 16, 1, 17,
			}},
		{35, {6, 30, 54, 78, 102, 126, 150}, {
			30, 12, 121, 7, 122,
			28, 12, 47, 26, 48,
			30, 39, 24, 14, 25,
			30, 22, 15, 41, 16,
			}},
		{36, {6, 24, 50, 76, 102, 128, 154}, {
			30, 6, 121, 14, 122,
			28, 6, 47, 34, 48,
			30, 46, 24, 10, 25,
			30, 2, 15, 64, 16,
			}},
		{37, {6, 28, 54, 80, 106, 132, 158}, {
			30, 17, 122, 4, 123,
			28, 29, 46, 14, 47,
			30, 49, 24, 10, 25,
			30, 24, 15, 46, 16,
			}},
		{38, {6, 32, 58, 84, 110, 136, 162}, {
			30, 4, 122, 18, 123,
			28, 13, 46, 32, 47,
			30, 48, 24, 14, 25,
			30, 42, 15, 32, 16,
			}},
		{39, {6, 26, 54, 82, 110, 138, 166}, {
			30, 20, 117, 4, 118,
			28, 40, 47, 7, 48,
			30, 43, 24, 22, 25,
			30, 10, 15, 67, 16,
			}},
		{40, {6, 30, 58, 86, 114, 142, 170}, {
			30, 19, 118, 6, 119,
			28, 18, 47, 31, 48,
			30, 34, 24, 34, 25,
			30, 20, 15, 61, 16
			}},
	};

	if (number < 1 || number > 40)
		return nullptr;
	return allVersions + number - 1;
}